

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineLayoutCreateInfo *layout,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  Value set_layouts;
  Value range;
  Value push;
  Data local_88;
  Data local_78;
  Data local_68;
  Data local_58;
  Data local_48;
  Data *local_38;
  
  local_48.n.i64 = (Number)0x0;
  local_48.s.str = (Ch *)0x3000000000000;
  local_78._4_1_ = '\0';
  local_78._5_1_ = '\0';
  local_78._6_1_ = '\0';
  local_78._7_1_ = '\0';
  local_78._0_4_ = layout->flags;
  local_88.s.str = (Ch *)0x40500000016548f;
  local_88.n = (Number)0x5;
  local_78.s.str = (Ch *)((ulong)(-1 < (int)layout->flags) << 0x35 | 0x1d6000000000000);
  local_38 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,alloc);
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)0x4000000000000;
  if (layout->pushConstantRangeCount != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      local_68.n.i64 = (Number)0x0;
      local_68.s.str = (Ch *)0x3000000000000;
      uVar1 = *(uint *)((long)&layout->pPushConstantRanges->stageFlags + lVar3);
      local_78._4_1_ = '\0';
      local_78._5_1_ = '\0';
      local_78._6_1_ = '\0';
      local_78._7_1_ = '\0';
      local_78._0_4_ = uVar1;
      local_88.s.str = (Ch *)0x405000000165455;
      local_88.n = (Number)0xa;
      local_78.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_88.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_78.s,alloc);
      uVar1 = *(uint *)((long)&layout->pPushConstantRanges->size + lVar3);
      local_78._4_1_ = '\0';
      local_78._5_1_ = '\0';
      local_78._6_1_ = '\0';
      local_78._7_1_ = '\0';
      local_78._0_4_ = uVar1;
      local_88.s.str = (Ch *)0x40500000016e02c;
      local_88.n = (Number)0x4;
      local_78.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_88.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_78.s,alloc);
      uVar1 = *(uint *)((long)&layout->pPushConstantRanges->offset + lVar3);
      local_78._4_1_ = '\0';
      local_78._5_1_ = '\0';
      local_78._6_1_ = '\0';
      local_78._7_1_ = '\0';
      local_78._0_4_ = uVar1;
      local_88.s.str = (Ch *)0x405000000165472;
      local_88.n.i64 = (Number)0x6;
      local_78.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_88.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_78.s,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_58.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_68.s,alloc);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (uVar2 < layout->pushConstantRangeCount);
  }
  local_78.s.str = (Ch *)0x40500000016551e;
  local_78.n = (Number)0x12;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,alloc);
  local_88.n = (Number)0x0;
  local_88.s.str = (Ch *)0x4000000000000;
  if (layout->setLayoutCount != 0) {
    uVar2 = 0;
    do {
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)&local_78.s,(uint64_t)layout->pSetLayouts[uVar2],alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_88.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_78.s,alloc);
      uVar2 = uVar2 + 1;
    } while (uVar2 < layout->setLayoutCount);
  }
  local_78.s.str = (Ch *)0x405000000165531;
  local_78.n = (Number)0xa;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  if (&local_48 != local_38) {
    local_38->n = local_48.n;
    (&local_38->n)[1] = (Number)local_48.s.str;
  }
  return SUB81(local_38,0);
}

Assistant:

static bool json_value(const VkPipelineLayoutCreateInfo& layout, Allocator& alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", layout.flags, alloc);
	Value push(kArrayType);
	for (uint32_t i = 0; i < layout.pushConstantRangeCount; i++)
	{
		Value range(kObjectType);
		range.AddMember("stageFlags", layout.pPushConstantRanges[i].stageFlags, alloc);
		range.AddMember("size", layout.pPushConstantRanges[i].size, alloc);
		range.AddMember("offset", layout.pPushConstantRanges[i].offset, alloc);
		push.PushBack(range, alloc);
	}
	p.AddMember("pushConstantRanges", push, alloc);

	Value set_layouts(kArrayType);
	for (uint32_t i = 0; i < layout.setLayoutCount; i++)
		set_layouts.PushBack(uint64_string(api_object_cast<uint64_t>(layout.pSetLayouts[i]), alloc), alloc);
	p.AddMember("setLayouts", set_layouts, alloc);

	*out_value = p;
	return true;
}